

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O2

bool __thiscall LiteScript::Memory::SaveVariable(Memory *this,ostream *stream,uint i)

{
  _BasicMemory_1 *this_00;
  bool bVar1;
  Object *pOVar2;
  OStreamer *this_01;
  Type *pTVar3;
  Variable v;
  OStreamer streamer;
  Nullable<LiteScript::Variable> local_40;
  
  this_00 = (_BasicMemory_1 *)(this->arr)._M_elems[i >> 0x10];
  if (this_00 != (_BasicMemory_1 *)0x0) {
    streamer.stream = stream;
    bVar1 = _BasicMemory_1::FlagsProtect(this_00,i & 0xffff);
    if (bVar1) {
      std::operator<<(stream,'\0');
      OStreamer::Write<unsigned_int>(stream,i);
      return true;
    }
    GetVariable(&local_40,this,i);
    Variable::Variable(&v,(Variable *)&local_40);
    Nullable<LiteScript::Variable>::Nullify(&local_40);
    std::operator<<(stream,'\x01');
    pOVar2 = Variable::operator->(&v);
    this_01 = OStreamer::operator<<(&streamer,&pOVar2->ID);
    pOVar2 = Variable::operator->(&v);
    pTVar3 = Object::GetType(pOVar2);
    local_40.data._0_4_ = Type::GetID(pTVar3);
    OStreamer::operator<<(this_01,(uint *)&local_40);
    pOVar2 = Variable::operator->(&v);
    pTVar3 = Object::GetType(pOVar2);
    pOVar2 = Variable::operator*(&v);
    (*pTVar3->_vptr_Type[0x26])(pTVar3,stream,pOVar2,SaveVariable,0);
    Variable::~Variable(&v);
  }
  return false;
}

Assistant:

bool LiteScript::Memory::SaveVariable(std::ostream &stream, unsigned int i) {
    OStreamer streamer(stream);
    unsigned int block = i >> 16;
    if (this->arr[block] != nullptr) {
        if (((LiteScript::_BasicMemory_1 *) (this->arr[block]))->FlagsProtect(i & 0xffff)) {
            streamer << (unsigned char)0 << i;
            return true;
        }
        else {
            Variable v = *this->GetVariable(i);
            streamer << (unsigned char)1 << v->ID << v->GetType().GetID();
            v->GetType().Save(stream, *v, &Memory::SaveVariable);
            return false;
        }
    }
    return false;
}